

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pair.cc
# Opt level: O2

int bio_read(BIO *bio,char *buf,int size_)

{
  long lVar1;
  long lVar2;
  uint __line;
  ulong uVar3;
  ulong uVar4;
  char *__assertion;
  ulong uVar5;
  ulong uVar6;
  size_t __n;
  
  BIO_clear_retry_flags(bio);
  if (bio->init == 0) {
    return 0;
  }
  if ((long *)bio->ptr == (long *)0x0) {
    __assertion = "b != NULL";
    __line = 0x76;
  }
  else {
    lVar1 = *bio->ptr;
    if (lVar1 == 0) {
      __assertion = "b->peer != NULL";
      __line = 0x77;
    }
    else {
      lVar1 = *(long *)(lVar1 + 0x28);
      if (lVar1 == 0) {
        __assertion = "peer_b != NULL";
        __line = 0x79;
      }
      else {
        if (*(long *)(lVar1 + 0x28) != 0) {
          *(undefined8 *)(lVar1 + 0x30) = 0;
          if (size_ == 0 || buf == (char *)0x0) {
            return 0;
          }
          uVar5 = (ulong)size_;
          uVar4 = *(ulong *)(lVar1 + 0x10);
          if (uVar4 == 0) {
            if (*(int *)(lVar1 + 8) != 0) {
              return 0;
            }
            BIO_set_retry_read(bio);
            if (*(ulong *)(lVar1 + 0x20) < uVar5) {
              uVar5 = *(ulong *)(lVar1 + 0x20);
            }
            *(ulong *)(lVar1 + 0x30) = uVar5;
            return -1;
          }
          uVar6 = uVar5;
          if (uVar4 < uVar5) {
            uVar5 = uVar4;
            uVar6 = uVar4;
          }
          do {
            if (uVar4 < uVar5) {
              __assert_fail("rest <= peer_b->len",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/pair.cc"
                            ,0x9f,"int bio_read(BIO *, char *, int)");
            }
            lVar2 = *(long *)(lVar1 + 0x18);
            uVar3 = *(ulong *)(lVar1 + 0x20);
            __n = uVar3 - lVar2;
            if (lVar2 + uVar5 <= uVar3) {
              __n = uVar5;
            }
            if (uVar3 < __n + lVar2) {
              __assert_fail("peer_b->offset + chunk <= peer_b->size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/pair.cc"
                            ,0xa6,"int bio_read(BIO *, char *, int)");
            }
            if (__n != 0) {
              memcpy(buf,(void *)(lVar2 + *(long *)(lVar1 + 0x28)),__n);
              uVar4 = *(ulong *)(lVar1 + 0x10);
            }
            uVar4 = uVar4 - __n;
            *(ulong *)(lVar1 + 0x10) = uVar4;
            if (uVar4 == 0) {
              if (uVar5 != __n) {
                __assert_fail("chunk == rest",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/pair.cc"
                              ,0xb4,"int bio_read(BIO *, char *, int)");
              }
              *(undefined8 *)(lVar1 + 0x18) = 0;
            }
            else {
              uVar3 = *(long *)(lVar1 + 0x18) + __n;
              *(ulong *)(lVar1 + 0x18) = uVar3;
              if (*(ulong *)(lVar1 + 0x20) < uVar3) {
                __assert_fail("peer_b->offset <= peer_b->size",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/pair.cc"
                              ,0xad,"int bio_read(BIO *, char *, int)");
              }
              if (uVar3 == *(ulong *)(lVar1 + 0x20)) {
                *(undefined8 *)(lVar1 + 0x18) = 0;
              }
              buf = buf + __n;
            }
            uVar5 = uVar5 - __n;
          } while (uVar5 != 0);
          return (int)uVar6;
        }
        __assertion = "peer_b->buf != NULL";
        __line = 0x7a;
      }
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/pair.cc"
                ,__line,"int bio_read(BIO *, char *, int)");
}

Assistant:

static int bio_read(BIO *bio, char *buf, int size_) {
  size_t size = size_;
  size_t rest;
  struct bio_bio_st *b, *peer_b;

  BIO_clear_retry_flags(bio);

  if (!bio->init) {
    return 0;
  }

  b = reinterpret_cast<bio_bio_st *>(bio->ptr);
  assert(b != NULL);
  assert(b->peer != NULL);
  peer_b = reinterpret_cast<bio_bio_st *>(b->peer->ptr);
  assert(peer_b != NULL);
  assert(peer_b->buf != NULL);

  peer_b->request = 0;  // will be set in "retry_read" situation

  if (buf == NULL || size == 0) {
    return 0;
  }

  if (peer_b->len == 0) {
    if (peer_b->closed) {
      return 0;  // writer has closed, and no data is left
    } else {
      BIO_set_retry_read(bio);  // buffer is empty
      if (size <= peer_b->size) {
        peer_b->request = size;
      } else {
        // don't ask for more than the peer can
        // deliver in one write
        peer_b->request = peer_b->size;
      }
      return -1;
    }
  }

  // we can read
  if (peer_b->len < size) {
    size = peer_b->len;
  }

  // now read "size" bytes
  rest = size;

  assert(rest > 0);
  // one or two iterations
  do {
    size_t chunk;

    assert(rest <= peer_b->len);
    if (peer_b->offset + rest <= peer_b->size) {
      chunk = rest;
    } else {
      // wrap around ring buffer
      chunk = peer_b->size - peer_b->offset;
    }
    assert(peer_b->offset + chunk <= peer_b->size);

    OPENSSL_memcpy(buf, peer_b->buf + peer_b->offset, chunk);

    peer_b->len -= chunk;
    if (peer_b->len) {
      peer_b->offset += chunk;
      assert(peer_b->offset <= peer_b->size);
      if (peer_b->offset == peer_b->size) {
        peer_b->offset = 0;
      }
      buf += chunk;
    } else {
      // buffer now empty, no need to advance "buf"
      assert(chunk == rest);
      peer_b->offset = 0;
    }
    rest -= chunk;
  } while (rest);

  // |size| is bounded by the buffer size, which fits in |int|.
  return (int)size;
}